

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngstest.c
# Opt level: O0

void gpc_glin(Pixel *out,Pixel *in,Background *back)

{
  png_uint_16 pVar1;
  double dVar2;
  Background *back_local;
  Pixel *in_local;
  Pixel *out_local;
  
  if ((in->r == in->g) && (in->g == in->b)) {
    pVar1 = ilinear(in->g);
    out->b = (uint)pVar1;
    out->g = (uint)pVar1;
    out->r = (uint)pVar1;
  }
  else {
    dVar2 = YfromRGB(sRGB_to_d[in->r],sRGB_to_d[in->g],sRGB_to_d[in->b]);
    pVar1 = u16d(dVar2 * 65535.0);
    out->b = (uint)pVar1;
    out->g = (uint)pVar1;
    out->r = (uint)pVar1;
  }
  out->a = 0xffff;
  return;
}

Assistant:

static void
gpc_glin(Pixel *out, const Pixel *in, const Background *back)
{
   (void)back;

   if (in->r == in->g && in->g == in->b)
      out->r = out->g = out->b = ilinear(in->g);

   else
      out->r = out->g = out->b = u16d(65535 *
         YfromRGB(sRGB_to_d[in->r], sRGB_to_d[in->g], sRGB_to_d[in->b]));

   out->a = 65535;
}